

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

value_type * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[2]>
          (value_type *__return_storage_ptr__,void *this,char (*v) [2])

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  uint *local_80;
  long local_78;
  uint local_70 [2];
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  uint *local_40;
  long local_38;
  uint local_30 [2];
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  cVar1 = *this;
  if (cVar1 == '\x01') {
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,*(long *)((long)this + 8),
               *(long *)((long)this + 0x10) + *(long *)((long)this + 8));
  }
  else {
    local_80 = local_70;
    sVar3 = strlen(*v);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,v,*v + sVar3);
    lVar2 = local_78;
    local_40 = local_30;
    if (local_80 == local_70) {
      uStack_28 = uStack_68;
      uStack_24 = uStack_64;
    }
    else {
      local_40 = local_80;
    }
    local_38 = local_78;
    local_78 = 0;
    local_70[0] = local_70[0] & 0xffffff00;
    local_60 = local_50;
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,lVar2 + (long)local_40);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_60,local_60 + local_58);
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (cVar1 == '\0') {
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

optional_constexpr value_type value_or( U && v ) const optional_ref_qual
    {
        return has_value() ? contained.value() : static_cast<T>(std::forward<U>( v ) );
    }